

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

int assert_null(void *v,char *testcase,int line)

{
  test_counter = test_counter + 1;
  if (v == (void *)0x0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
    printf("# Expected NULL value, but observed Non-NULL instead (line %d)\n",(ulong)(uint)line);
    global_err = global_err + 1;
  }
  return (uint)(v != (void *)0x0);
}

Assistant:

int assert_null(const void *v, const char *testcase, int line)
{
    test_counter++;
    int err = !!v;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected NULL value, but observed Non-NULL instead (line %d)\n", line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}